

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O2

bool __thiscall
Kernel::ScanAndApplyFormulaUnitTransformer::apply
          (ScanAndApplyFormulaUnitTransformer *this,UnitList **units)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  List<Kernel::Unit_*> **ppLVar3;
  bool bVar4;
  DelIterator uit;
  Unit *newUnit;
  DelIterator local_48;
  Unit *local_30;
  
  (*this->_vptr_ScanAndApplyFormulaUnitTransformer[2])(this,*units);
  local_48._prev = (UnitList *)0x0;
  local_48._cur = (UnitList *)0x0;
  bVar4 = false;
  local_48._lst = units;
  while( true ) {
    ppLVar3 = &(local_48._cur)->_tail;
    if (local_48._cur == (UnitList *)0x0) {
      ppLVar3 = local_48._lst;
    }
    if (*ppLVar3 == (List<Kernel::Unit_*> *)0x0) break;
    ppLVar3 = local_48._lst;
    if (local_48._cur != (UnitList *)0x0) {
      ppLVar3 = &(local_48._cur)->_tail;
      local_48._prev = local_48._cur;
    }
    local_48._cur = *ppLVar3;
    bVar1 = apply(this,(local_48._cur)->_head,&local_30);
    if (bVar1) {
      if (local_30 == (Unit *)0x0) {
        Lib::List<Kernel::Unit_*>::DelIterator::del(&local_48);
      }
      else {
        (local_48._cur)->_head = local_30;
      }
      bVar4 = true;
    }
  }
  iVar2 = (*this->_vptr_ScanAndApplyFormulaUnitTransformer[3])(this);
  if ((List<Kernel::Unit_*> *)CONCAT44(extraout_var,iVar2) != (List<Kernel::Unit_*> *)0x0) {
    Lib::List<Kernel::Unit_*>::DelIterator::insert
              (&local_48,(List<Kernel::Unit_*> *)CONCAT44(extraout_var,iVar2));
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ScanAndApplyFormulaUnitTransformer::apply(UnitList*& units)
{
  scan(units);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    Unit* newUnit;

    if(!apply(u, newUnit)) {
      continue;
    }
    if(newUnit==0) {
      uit.del();
    }
    else {
      uit.replace(newUnit);
    }
    modified = true;
  }

  UnitList* added = getIntroducedFormulas();
  if(added) {
    modified = true;
    uit.insert(added);
  }

  return modified;
}